

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O1

StackSliceArray ts_stack_pop_pending(Stack *self,StackVersion version)

{
  uint32_t *puVar1;
  undefined8 *puVar2;
  StackHead *self_00;
  uint32_t uVar3;
  undefined4 uVar4;
  StackNode *pSVar5;
  StackIterator *pSVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  SubtreeArray self_01;
  undefined8 uVar10;
  undefined4 uVar11;
  uint uVar12;
  uint uVar13;
  StackIterator *pSVar14;
  Subtree *pSVar15;
  StackSlice *extraout_RAX;
  StackSlice *pSVar16;
  SubtreeArray *pSVar17;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  _Bool *p_Var18;
  Subtree SVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  long *__size;
  StackNode *pSVar25;
  bool bVar26;
  StackSliceArray SVar27;
  SubtreeArray subtrees;
  byte local_89;
  SubtreeArray local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  
  (self->slices).size = 0;
  (self->iterators).size = 0;
  if ((self->heads).size <= version) {
LAB_0012ff12:
    __assert_fail("(uint32_t)version < (&self->heads)->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                  ,0x118,
                  "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)");
  }
  pSVar5 = (self->heads).contents[version].node;
  uVar13 = (self->iterators).capacity;
  if ((self->iterators).size != uVar13) goto LAB_0012facc;
  uVar23 = 8;
  if (8 < uVar13 * 2) {
    uVar23 = uVar13 * 2;
  }
  if (uVar23 <= uVar13) goto LAB_0012facc;
  pSVar14 = (self->iterators).contents;
  __size = (long *)(ulong)uVar23;
  if (pSVar14 == (StackIterator *)0x0) {
LAB_0012faae:
    uVar13 = 0x20;
    pSVar14 = (StackIterator *)calloc((size_t)__size,0x20);
    if (pSVar14 == (StackIterator *)0x0) {
      ts_stack_pop_pending_cold_6();
      pSVar16 = extraout_RAX;
      uVar24 = extraout_RDX;
      if (uVar13 != (uint)extraout_RDX) {
        if (uVar13 <= (uint)extraout_RDX) {
          __assert_fail("v2 < v1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                        ,0x265,"void ts_stack_renumber_version(Stack *, StackVersion, StackVersion)"
                       );
        }
        if (*(uint *)(__size + 1) <= uVar13) {
          __assert_fail("(uint32_t)v1 < self->heads.size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                        ,0x266,"void ts_stack_renumber_version(Stack *, StackVersion, StackVersion)"
                       );
        }
        puVar2 = (undefined8 *)(*__size + (ulong)uVar13 * 0x28);
        self_00 = (StackHead *)(*__size + (extraout_RDX & 0xffffffff) * 0x28);
        if ((self_00->summary != (StackSummary *)0x0) && (puVar2[2] == 0)) {
          puVar2[2] = self_00->summary;
          self_00->summary = (StackSummary *)0x0;
        }
        stack_head_delete(self_00,(StackNodeArray *)(__size + 6),(SubtreePool *)__size[9]);
        *(undefined8 *)&self_00->status = puVar2[4];
        pSVar5 = (StackNode *)*puVar2;
        SVar19 = *(Subtree *)(puVar2 + 1);
        uVar9 = puVar2[3];
        self_00->summary = (StackSummary *)puVar2[2];
        self_00->node_count_at_last_error = (int)uVar9;
        self_00->lookahead_when_paused = (short)((ulong)uVar9 >> 0x20);
        *(short *)&self_00->field_0x1e = (short)((ulong)uVar9 >> 0x30);
        self_00->node = pSVar5;
        self_00->last_external_token = SVar19;
        if (*(uint *)(__size + 1) <= uVar13) {
          __assert_fail("index < self->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/array.h"
                        ,0x4f,"void array__erase(VoidArray *, size_t, uint32_t)");
        }
        pSVar16 = (StackSlice *)
                  memmove((void *)(*__size + (ulong)uVar13 * 0x28),
                          (void *)(*__size + (ulong)(uVar13 + 1) * 0x28),
                          (ulong)(*(uint *)(__size + 1) + ~uVar13) * 0x28);
        *(int *)(__size + 1) = (int)__size[1] + -1;
        uVar24 = extraout_RDX_00;
      }
      SVar27.size = (int)uVar24;
      SVar27.capacity = (int)(uVar24 >> 0x20);
      SVar27.contents = pSVar16;
      return SVar27;
    }
  }
  else {
    __size = (long *)((long)__size << 5);
    pSVar14 = (StackIterator *)realloc(pSVar14,(size_t)__size);
    if (pSVar14 == (StackIterator *)0x0) {
      ts_stack_pop_pending_cold_1();
      goto LAB_0012faae;
    }
  }
  (self->iterators).contents = pSVar14;
  (self->iterators).capacity = uVar23;
LAB_0012facc:
  pSVar14 = (self->iterators).contents;
  uVar13 = (self->iterators).size;
  (self->iterators).size = uVar13 + 1;
  pSVar14[uVar13].node = pSVar5;
  pSVar17 = &pSVar14[uVar13].subtrees;
  pSVar17->contents = (Subtree *)0x0;
  pSVar17->size = 0;
  pSVar17->capacity = 0;
  pSVar14[uVar13].subtree_count = 0;
  pSVar14[uVar13].is_pending = true;
  uVar13 = (self->iterators).size;
  if (uVar13 != 0) {
    uVar24 = 0;
    do {
      do {
        pSVar14 = (self->iterators).contents;
        uVar23 = 0;
        if (pSVar14[uVar24].subtree_count != 0) {
          uVar23 = (uint)pSVar14[uVar24].is_pending * 2 + 1;
        }
        pSVar5 = pSVar14[uVar24].node;
        bVar26 = true;
        if ((uVar23 & 1) == 0) {
          bVar26 = pSVar5->link_count == 0;
        }
        if (1 < uVar23) {
          pSVar17 = &pSVar14[uVar24].subtrees;
          local_58.contents = pSVar17->contents;
          uVar7 = pSVar14[uVar24].subtrees.size;
          uVar8 = pSVar14[uVar24].subtrees.capacity;
          uVar10 = pSVar17->contents;
          uVar11 = pSVar17->size;
          self_01.size = uVar11;
          self_01.contents = (Subtree *)uVar10;
          local_58.size = uVar7;
          local_58.capacity = uVar8;
          if (!bVar26) {
            self_01.capacity = uVar8;
            ts_subtree_array_copy(self_01,&local_58);
          }
          if (1 < local_58.size) {
            uVar20 = 0;
            uVar12 = local_58.size;
            do {
              uVar12 = uVar12 - 1;
              SVar19 = local_58.contents[uVar20];
              local_58.contents[uVar20] = local_58.contents[uVar12];
              local_58.contents[uVar12] = SVar19;
              uVar20 = uVar20 + 1;
            } while (local_58.size >> 1 != uVar20);
          }
          ts_stack__add_slice(self,version,pSVar5,&local_58);
        }
        uVar12 = (uint)uVar24;
        if (bVar26) {
          if (uVar23 < 2) {
            ts_subtree_array_delete(self->subtree_pool,&pSVar14[uVar24].subtrees);
          }
          uVar23 = (self->iterators).size;
          if (uVar23 <= uVar12) {
LAB_0012fedb:
            __assert_fail("index < self->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/array.h"
                          ,0x4f,"void array__erase(VoidArray *, size_t, uint32_t)");
          }
          pSVar14 = (self->iterators).contents;
          memmove(pSVar14 + uVar24,pSVar14 + uVar24 + 1,(ulong)(uVar23 + ~uVar12) << 5);
          puVar1 = &(self->iterators).size;
          *puVar1 = *puVar1 - 1;
          uVar13 = uVar13 - 1;
        }
        else {
          uVar20 = (ulong)pSVar5->link_count;
          if (pSVar5->link_count != 0) {
            p_Var18 = &pSVar5->links[1].is_pending;
            uVar21 = 0;
            do {
              uVar21 = uVar21 + 1;
              if (uVar21 == uVar20) {
                pSVar25 = pSVar5->links[0].node;
                SVar19 = pSVar5->links[0].subtree;
                local_89 = pSVar5->links[0].is_pending;
                pSVar14 = (self->iterators).contents + uVar24;
LAB_0012fd83:
                pSVar14->node = pSVar25;
                if (SVar19.ptr == (SubtreeHeapData *)0x0) {
                  pSVar14->subtree_count = pSVar14->subtree_count + 1;
                }
                else {
                  uVar23 = (pSVar14->subtrees).capacity;
                  if ((pSVar14->subtrees).size == uVar23) {
                    uVar22 = uVar23 * 2;
                    if (uVar22 < 9) {
                      uVar22 = 8;
                    }
                    if (uVar23 < uVar22) {
                      pSVar15 = (pSVar14->subtrees).contents;
                      if (pSVar15 == (Subtree *)0x0) {
                        pSVar15 = (Subtree *)calloc((ulong)uVar22,8);
                        if (pSVar15 == (Subtree *)0x0) {
                          ts_stack_pop_pending_cold_5();
                          goto LAB_0012ff02;
                        }
                      }
                      else {
                        pSVar15 = (Subtree *)realloc(pSVar15,(ulong)uVar22 << 3);
                        if (pSVar15 == (Subtree *)0x0) {
                          ts_stack_pop_pending_cold_4();
                          goto LAB_0012fedb;
                        }
                      }
                      (pSVar14->subtrees).contents = pSVar15;
                      (pSVar14->subtrees).capacity = uVar22;
                    }
                  }
                  uVar23 = (pSVar14->subtrees).size;
                  (pSVar14->subtrees).size = uVar23 + 1;
                  (pSVar14->subtrees).contents[uVar23] = SVar19;
                  ts_subtree_retain(SVar19);
                  if (((ulong)SVar19.ptr & 1) == 0) {
                    uVar23 = *(uint *)&(SVar19.ptr)->field_0x2c >> 2;
                  }
                  else {
                    uVar23 = (uint)((ulong)SVar19.ptr >> 3) & 0x1fffffff;
                  }
                  if (((uVar23 & 1) != 0) ||
                     (pSVar14->subtree_count = pSVar14->subtree_count + 1, (local_89 & 1) != 0))
                  goto LAB_0012fe38;
                }
                pSVar14->is_pending = false;
              }
              else if ((self->iterators).size < 0x40) {
                pSVar25 = ((StackLink *)(p_Var18 + -0x10))->node;
                SVar19 = *(Subtree *)(p_Var18 + -8);
                local_89 = *p_Var18;
                pSVar14 = (self->iterators).contents;
                local_58.contents = (Subtree *)pSVar14[uVar24].node;
                pSVar15 = pSVar14[uVar24].subtrees.contents;
                pSVar17 = &pSVar14[uVar24].subtrees;
                local_48._0_4_ = pSVar17->size;
                local_48._4_4_ = pSVar17->capacity;
                uStack_40 = pSVar17[1].contents;
                local_58.size = (uint32_t)pSVar15;
                local_58.capacity = (uint32_t)((ulong)pSVar15 >> 0x20);
                uVar23 = (self->iterators).capacity;
                if ((self->iterators).size != uVar23) {
LAB_0012fd2a:
                  pSVar14 = (self->iterators).contents;
                  uVar23 = (self->iterators).size;
                  (self->iterators).size = uVar23 + 1;
                  pSVar6 = pSVar14 + uVar23;
                  (pSVar6->subtrees).size = (undefined4)local_48;
                  (pSVar6->subtrees).capacity = local_48._4_4_;
                  *(undefined8 *)(&(pSVar6->subtrees).size + 2) = uStack_40;
                  pSVar14 = pSVar14 + uVar23;
                  pSVar14->node = (StackNode *)local_58.contents;
                  (pSVar14->subtrees).contents =
                       (Subtree *)CONCAT44(local_58.capacity,local_58.size);
                  uVar3 = (self->iterators).size;
                  if (uVar3 == 0) {
                    __assert_fail("(uint32_t)(&self->iterators)->size - 1 < (&self->iterators)->size"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                                  ,0x151,
                                  "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)"
                                 );
                  }
                  uVar23 = uVar3 - 1;
                  pSVar6 = (self->iterators).contents;
                  pSVar14 = pSVar6 + uVar23;
                  pSVar17 = &pSVar6[uVar23].subtrees;
                  ts_subtree_array_copy(*pSVar17,pSVar17);
                  goto LAB_0012fd83;
                }
                uVar22 = uVar23 * 2;
                if (uVar22 < 9) {
                  uVar22 = 8;
                }
                if (uVar22 <= uVar23) goto LAB_0012fd2a;
                if (pSVar14 == (StackIterator *)0x0) {
                  pSVar14 = (StackIterator *)calloc((ulong)uVar22,0x20);
                  if (pSVar14 != (StackIterator *)0x0) goto LAB_0012fd1d;
                }
                else {
                  pSVar14 = (StackIterator *)realloc(pSVar14,(ulong)uVar22 << 5);
                  if (pSVar14 != (StackIterator *)0x0) {
LAB_0012fd1d:
                    (self->iterators).contents = pSVar14;
                    (self->iterators).capacity = uVar22;
                    goto LAB_0012fd2a;
                  }
LAB_0012ff02:
                  ts_stack_pop_pending_cold_2();
                }
                ts_stack_pop_pending_cold_3();
                goto LAB_0012ff12;
              }
LAB_0012fe38:
              uVar20 = (ulong)pSVar5->link_count;
              p_Var18 = p_Var18 + 0x18;
            } while (uVar21 < uVar20);
          }
          uVar24 = (ulong)(uVar12 + 1);
        }
      } while ((uint)uVar24 < uVar13);
      uVar13 = (self->iterators).size;
      uVar24 = 0;
    } while (uVar13 != 0);
  }
  pSVar16 = (self->slices).contents;
  uVar4 = (self->slices).size;
  SVar27 = self->slices;
  if (uVar4 != 0) {
    ts_stack_renumber_version(self,pSVar16->version,version);
    pSVar16->version = version;
  }
  return SVar27;
}

Assistant:

StackSliceArray ts_stack_pop_pending(Stack *self, StackVersion version) {
  StackSliceArray pop = stack__iter(self, version, pop_pending_callback, NULL, 0);
  if (pop.size > 0) {
    ts_stack_renumber_version(self, pop.contents[0].version, version);
    pop.contents[0].version = version;
  }
  return pop;
}